

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

Tim_Man_t * Tim_ManTrim(Tim_Man_t *p,Vec_Int_t *vBoxPres)

{
  float fVar1;
  uint uVar2;
  Tim_Obj_t *pTVar3;
  Tim_Obj_t *pTVar4;
  float *pfVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Tim_Man_t *pTVar14;
  ulong uVar15;
  Vec_Ptr_t *pVVar16;
  void **ppvVar17;
  float *pfVar18;
  ulong uVar19;
  Vec_Ptr_t *pVVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  iVar9 = vBoxPres->nSize;
  if (p->vBoxes == (Vec_Ptr_t *)0x0) {
    if (iVar9 != 0) goto LAB_00433f4e;
  }
  else {
    if (iVar9 != p->vBoxes->nSize) {
LAB_00433f4e:
      __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                    ,0xad,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
    if (iVar9 != 0) {
      uVar8 = Tim_ManBoxOutputFirst(p,0);
      goto LAB_0043389c;
    }
  }
  uVar8 = p->nCis;
LAB_0043389c:
  iVar9 = Tim_ManPoNum(p);
  auVar7 = _DAT_008403e0;
  pVVar20 = p->vBoxes;
  if (pVVar20 != (Vec_Ptr_t *)0x0) {
    iVar10 = pVVar20->nSize;
    if (0 < (long)iVar10) {
      uVar21 = 0;
      if (0 < vBoxPres->nSize) {
        uVar21 = vBoxPres->nSize;
      }
      if (uVar21 <= iVar10 - 1U) {
LAB_00433ed2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar22 = 0;
      do {
        if (vBoxPres->pArray[lVar22] != 0) {
          uVar8 = uVar8 + *(int *)((long)pVVar20->pArray[lVar22] + 0xc);
          iVar9 = iVar9 + *(int *)((long)pVVar20->pArray[lVar22] + 8);
        }
        lVar22 = lVar22 + 1;
      } while (iVar10 != lVar22);
    }
  }
  uVar21 = p->nCis;
  if ((uVar8 == uVar21) && (iVar9 == p->nCos)) {
    pTVar14 = Tim_ManDup(p,0);
    return pTVar14;
  }
  if ((int)uVar21 <= (int)uVar8) {
    __assert_fail("nNewCis < Tim_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xba,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  uVar2 = p->nCos;
  if ((int)uVar2 <= iVar9) {
    __assert_fail("nNewCos < Tim_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xbb,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  if ((0 < (int)uVar21) && (pTVar3 = p->pCis, pTVar3 != (Tim_Obj_t *)0x0)) {
    lVar22 = (ulong)uVar21 - 1;
    auVar24._8_4_ = (int)lVar22;
    auVar24._0_8_ = lVar22;
    auVar24._12_4_ = (int)((ulong)lVar22 >> 0x20);
    lVar22 = 0;
    auVar24 = auVar24 ^ _DAT_008403e0;
    auVar30 = _DAT_008403c0;
    auVar27 = _DAT_008403d0;
    do {
      auVar29 = auVar27 ^ auVar7;
      iVar10 = auVar24._4_4_;
      if ((bool)(~(auVar29._4_4_ == iVar10 && auVar24._0_4_ < auVar29._0_4_ ||
                  iVar10 < auVar29._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar3->TravId + lVar22) = 0;
      }
      if ((auVar29._12_4_ != auVar24._12_4_ || auVar29._8_4_ <= auVar24._8_4_) &&
          auVar29._12_4_ <= auVar24._12_4_) {
        *(undefined4 *)((long)&pTVar3[1].TravId + lVar22) = 0;
      }
      auVar29 = auVar30 ^ auVar7;
      iVar11 = auVar29._4_4_;
      if (iVar11 <= iVar10 && (iVar11 != iVar10 || auVar29._0_4_ <= auVar24._0_4_)) {
        *(undefined4 *)((long)&pTVar3[2].TravId + lVar22) = 0;
        *(undefined4 *)((long)&pTVar3[3].TravId + lVar22) = 0;
      }
      lVar26 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar26 + 4;
      lVar26 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 4;
      auVar30._8_8_ = lVar26 + 4;
      lVar22 = lVar22 + 0x60;
    } while ((ulong)(uVar21 + 3 >> 2) * 0x60 != lVar22);
  }
  auVar7 = _DAT_008403e0;
  if ((0 < (int)uVar2) && (pTVar3 = p->pCos, pTVar3 != (Tim_Obj_t *)0x0)) {
    lVar22 = (ulong)uVar2 - 1;
    auVar25._8_4_ = (int)lVar22;
    auVar25._0_8_ = lVar22;
    auVar25._12_4_ = (int)((ulong)lVar22 >> 0x20);
    lVar22 = 0;
    auVar25 = auVar25 ^ _DAT_008403e0;
    auVar29 = _DAT_008403c0;
    auVar28 = _DAT_008403d0;
    do {
      auVar30 = auVar28 ^ auVar7;
      iVar10 = auVar25._4_4_;
      if ((bool)(~(auVar30._4_4_ == iVar10 && auVar25._0_4_ < auVar30._0_4_ ||
                  iVar10 < auVar30._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar3->TravId + lVar22) = 0;
      }
      if ((auVar30._12_4_ != auVar25._12_4_ || auVar30._8_4_ <= auVar25._8_4_) &&
          auVar30._12_4_ <= auVar25._12_4_) {
        *(undefined4 *)((long)&pTVar3[1].TravId + lVar22) = 0;
      }
      auVar30 = auVar29 ^ auVar7;
      iVar11 = auVar30._4_4_;
      if (iVar11 <= iVar10 && (iVar11 != iVar10 || auVar30._0_4_ <= auVar25._0_4_)) {
        *(undefined4 *)((long)&pTVar3[2].TravId + lVar22) = 0;
        *(undefined4 *)((long)&pTVar3[3].TravId + lVar22) = 0;
      }
      lVar26 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 4;
      auVar28._8_8_ = lVar26 + 4;
      lVar26 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar26 + 4;
      lVar22 = lVar22 + 0x60;
    } while ((ulong)(uVar2 + 3 >> 2) * 0x60 != lVar22);
  }
  pTVar14 = Tim_ManStart(uVar8,iVar9);
  pTVar3 = pTVar14->pCis;
  pTVar4 = p->pCis;
  if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
    iVar10 = p->nCis;
  }
  else {
    iVar10 = Tim_ManBoxOutputFirst(p,0);
  }
  memcpy(pTVar3,pTVar4,(long)iVar10 * 0x18);
  pTVar3 = pTVar14->pCos;
  iVar11 = Tim_ManPoNum(p);
  iVar10 = p->nCos;
  pTVar4 = p->pCos;
  iVar12 = Tim_ManPoNum(p);
  iVar13 = Tim_ManPoNum(p);
  memcpy(pTVar3 + ((long)iVar9 - (long)iVar11),pTVar4 + ((long)iVar10 - (long)iVar12),
         (long)iVar13 * 0x18);
  pVVar20 = p->vDelayTables;
  if (pVVar20 != (Vec_Ptr_t *)0x0) {
    uVar8 = pVVar20->nSize;
    uVar15 = (ulong)(int)uVar8;
    if (0 < (long)uVar15) {
      pVVar16 = (Vec_Ptr_t *)malloc(0x10);
      uVar23 = 8;
      if (8 < uVar8) {
        uVar23 = (ulong)uVar8;
      }
      pVVar16->nCap = (int)uVar23;
      ppvVar17 = (void **)malloc(uVar23 << 3);
      pVVar16->pArray = ppvVar17;
      pVVar16->nSize = uVar8;
      memset(ppvVar17,0,uVar15 * 8);
      pTVar14->vDelayTables = pVVar16;
      if (0 < pVVar20->nSize) {
        uVar23 = 0;
        do {
          pfVar5 = (float *)pVVar20->pArray[uVar23];
          if (pfVar5 != (float *)0x0) {
            fVar1 = *pfVar5;
            if (uVar23 != (uint)(int)fVar1) {
              __assert_fail("i == (int)pDelayTable[0]",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                            ,0xd0,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
            }
            uVar8 = (int)(float)((ulong)*(undefined8 *)(pfVar5 + 1) >> 0x20) *
                    (int)(float)*(undefined8 *)(pfVar5 + 1);
            pfVar18 = (float *)malloc((long)(int)uVar8 * 4 + 0xc);
            *pfVar18 = (float)(int)fVar1;
            pfVar18[1] = (float)(int)pfVar5[1];
            pfVar18[2] = (float)(int)pfVar5[2];
            if (0 < (int)uVar8) {
              uVar19 = 0;
              do {
                pfVar18[uVar19 + 3] = pfVar5[uVar19 + 3];
                uVar19 = uVar19 + 1;
              } while (uVar8 != uVar19);
            }
            if (uVar15 <= uVar23) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (pVVar16->pArray[uVar23] != (void *)0x0) {
              __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                            ,0xda,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
            }
            pVVar16->pArray[uVar23] = pfVar18;
            pVVar20 = p->vDelayTables;
          }
          uVar23 = uVar23 + 1;
        } while ((long)uVar23 < (long)pVVar20->nSize);
      }
    }
  }
  if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (0 < p->vBoxes->nSize)) {
    iVar9 = 0;
    iVar10 = Tim_ManBoxOutputFirst(p,0);
    pVVar20 = p->vBoxes;
    if (pVVar20 != (Vec_Ptr_t *)0x0) {
      iVar9 = pVVar20->nSize;
    }
    pVVar16 = (Vec_Ptr_t *)malloc(0x10);
    iVar11 = 8;
    if (6 < iVar9 - 1U) {
      iVar11 = iVar9;
    }
    pVVar16->nSize = 0;
    pVVar16->nCap = iVar11;
    iVar9 = 0;
    if (iVar11 == 0) {
      ppvVar17 = (void **)0x0;
    }
    else {
      ppvVar17 = (void **)malloc((long)iVar11 << 3);
    }
    pVVar16->pArray = ppvVar17;
    pTVar14->vBoxes = pVVar16;
    if (0 < pVVar20->nSize) {
      lVar22 = 0;
      iVar9 = 0;
      do {
        if (vBoxPres->nSize <= lVar22) goto LAB_00433ed2;
        if (vBoxPres->pArray[lVar22] != 0) {
          pvVar6 = pVVar20->pArray[lVar22];
          Tim_ManCreateBox(pTVar14,iVar9,*(int *)((long)pvVar6 + 8),iVar10,
                           *(int *)((long)pvVar6 + 0xc),*(int *)((long)pvVar6 + 0x10),
                           *(int *)((long)pvVar6 + 0x18));
          if (pTVar14->vBoxes == (Vec_Ptr_t *)0x0) {
            iVar11 = -1;
          }
          else {
            iVar11 = pTVar14->vBoxes->nSize + -1;
          }
          iVar13 = (int)lVar22;
          iVar12 = Tim_ManBoxCopy(p,iVar13);
          if (iVar12 != -1) {
            iVar13 = Tim_ManBoxCopy(p,iVar13);
          }
          Tim_ManBoxSetCopy(pTVar14,iVar11,iVar13);
          iVar10 = iVar10 + *(int *)((long)pvVar6 + 0xc);
          iVar9 = iVar9 + *(int *)((long)pvVar6 + 8);
          pVVar20 = p->vBoxes;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < pVVar20->nSize);
    }
    iVar11 = Tim_ManPoNum(p);
    if (iVar10 != pTVar14->nCis) {
      __assert_fail("curPi == Tim_ManCiNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                    ,0xed,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
    if (iVar11 + iVar9 != pTVar14->nCos) {
      __assert_fail("curPo == Tim_ManCoNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                    ,0xee,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
  }
  return pTVar14;
}

Assistant:

Tim_Man_t * Tim_ManTrim( Tim_Man_t * p, Vec_Int_t * vBoxPres )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nNewCis, nNewCos, nInputs, nOutputs;
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = Tim_ManPiNum(p);
    nNewCos = Tim_ManPoNum(p);
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                nNewCis += pBox->nOutputs;
                nNewCos += pBox->nInputs;
            }
    if ( nNewCis == Tim_ManCiNum(p) && nNewCos == Tim_ManCoNum(p) )
        return Tim_ManDup( p, 0 );
    assert( nNewCis < Tim_ManCiNum(p) );
    assert( nNewCos < Tim_ManCoNum(p) );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * Tim_ManPiNum(p) );
    memcpy( pNew->pCos + nNewCos - Tim_ManPoNum(p), 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * Tim_ManPoNum(p) );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = Tim_ManPiNum(p);
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
                Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, i) == -1 ? i : Tim_ManBoxCopy(p, i) );
                curPi += pBox->nOutputs;
                curPo += pBox->nInputs;
            }
        curPo += Tim_ManPoNum(p);
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}